

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

void __thiscall deqp::gls::AttributePack::clearArrays(AttributePack *this)

{
  AttributeArray *this_00;
  bool bVar1;
  reference ppAVar2;
  __normal_iterator<deqp::gls::(anonymous_namespace)::AttributeArray_**,_std::vector<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>_>
  local_20;
  __normal_iterator<deqp::gls::(anonymous_namespace)::AttributeArray_**,_std::vector<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>_>
  local_18;
  iterator itr;
  AttributePack *this_local;
  
  itr._M_current = (AttributeArray **)this;
  local_18._M_current =
       (AttributeArray **)
       std::
       vector<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
       ::begin(&this->m_arrays);
  while( true ) {
    local_20._M_current =
         (AttributeArray **)
         std::
         vector<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
         ::end(&this->m_arrays);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppAVar2 = __gnu_cxx::
              __normal_iterator<deqp::gls::(anonymous_namespace)::AttributeArray_**,_std::vector<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>_>
              ::operator*(&local_18);
    this_00 = *ppAVar2;
    if (this_00 != (AttributeArray *)0x0) {
      anon_unknown_1::AttributeArray::~AttributeArray(this_00);
      operator_delete(this_00,0x58);
    }
    __gnu_cxx::
    __normal_iterator<deqp::gls::(anonymous_namespace)::AttributeArray_**,_std::vector<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>_>
    ::operator++(&local_18,0);
  }
  std::
  vector<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
  ::clear(&this->m_arrays);
  return;
}

Assistant:

void AttributePack::clearArrays (void)
{
	for (std::vector<AttributeArray*>::iterator itr = m_arrays.begin(); itr != m_arrays.end(); itr++)
		delete *itr;
	m_arrays.clear();
}